

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-fds.c
# Opt level: O1

int insert_wsi(lws_context *context,lws *wsi)

{
  uint uVar1;
  lws **pplVar2;
  lws *plVar3;
  lws **pplVar4;
  int iVar5;
  bool bVar6;
  
  sanity_assert_no_wsi_traces(context,wsi);
  pplVar2 = context->lws_lookup;
  if ((context->field_0x7b8 & 4) == 0) {
    if (pplVar2[(wsi->desc).sockfd] != (lws *)0x0) {
      __assert_fail("context->lws_lookup[wsi->desc.sockfd - lws_plat_socket_offset()] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/plat/unix/unix-fds.c"
                    ,0x85,"int insert_wsi(const struct lws_context *, struct lws *)");
    }
    pplVar2[(wsi->desc).sockfd] = wsi;
LAB_0012f512:
    iVar5 = 0;
  }
  else {
    uVar1 = context->max_fds;
    sanity_assert_no_sockfd_traces(context,(wsi->desc).sockfd);
    pplVar4 = context->lws_lookup;
    bVar6 = pplVar4 == pplVar2 + uVar1;
    if (!bVar6) {
      plVar3 = *pplVar4;
      while (plVar3 != (lws *)0x0) {
        pplVar4 = pplVar4 + 1;
        bVar6 = pplVar4 == pplVar2 + uVar1;
        if (bVar6) goto LAB_0012f568;
        plVar3 = *pplVar4;
      }
      if (!bVar6) {
        *pplVar4 = wsi;
        goto LAB_0012f512;
      }
    }
LAB_0012f568:
    iVar5 = 1;
    _lws_log(1,"%s: reached max fds\n","insert_wsi");
  }
  return iVar5;
}

Assistant:

int
insert_wsi(const struct lws_context *context, struct lws *wsi)
{
	struct lws **p, **done;

	if (sanity_assert_no_wsi_traces(context, wsi))
		return 0;

	if (!context->max_fds_unrelated_to_ulimit) {
		assert(context->lws_lookup[wsi->desc.sockfd -
		                           lws_plat_socket_offset()] == 0);

		context->lws_lookup[wsi->desc.sockfd - \
				  lws_plat_socket_offset()] = wsi;

		return 0;
	}

	/* slow fds handling */

	p = context->lws_lookup;
	done = &p[context->max_fds];

	/* confirm fd isn't already in use by a wsi */

	if (sanity_assert_no_sockfd_traces(context, wsi->desc.sockfd))
		return 0;

	p = context->lws_lookup;

	/* find an empty slot */

	while (p != done && *p)
		p++;

	if (p == done) {
		lwsl_err("%s: reached max fds\n", __func__);
		return 1;
	}

	*p = wsi;

	return 0;
}